

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMiMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  Scene *pSVar6;
  Ref<embree::Geometry> *pRVar7;
  Geometry *pGVar8;
  long lVar9;
  long lVar10;
  RTCIntersectArguments *pRVar11;
  RTCRayQueryContext *pRVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined4 uVar87;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  uint uVar112;
  AABBNodeMB4D *node1;
  ulong uVar113;
  long lVar114;
  long lVar115;
  int iVar116;
  ulong uVar117;
  ulong uVar118;
  undefined1 (*pauVar119) [16];
  long lVar120;
  undefined1 (*pauVar121) [16];
  ulong uVar122;
  ulong uVar123;
  ulong uVar124;
  ulong uVar125;
  ulong uVar126;
  ulong in_R9;
  long lVar127;
  ulong uVar128;
  undefined1 (*pauVar129) [16];
  ulong uVar130;
  ulong uVar131;
  ulong uVar132;
  long lVar133;
  ulong uVar134;
  ulong uVar135;
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [64];
  float fVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar154;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [64];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar174 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [64];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  undefined1 auVar185 [32];
  undefined1 auVar186 [64];
  float fVar187;
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  float fVar194;
  undefined1 auVar190 [32];
  float fVar192;
  float fVar193;
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar191 [64];
  uint uVar198;
  undefined1 auVar199 [32];
  uint uVar201;
  uint uVar202;
  uint uVar203;
  uint uVar204;
  uint uVar205;
  uint uVar206;
  undefined1 auVar200 [64];
  undefined1 auVar207 [32];
  undefined1 auVar208 [64];
  undefined1 auVar209 [64];
  float fVar210;
  undefined1 auVar211 [16];
  float fVar216;
  undefined1 auVar212 [32];
  float fVar214;
  float fVar215;
  float fVar217;
  float fVar218;
  float fVar219;
  undefined1 auVar213 [64];
  undefined1 auVar220 [32];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [16];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_28f4;
  RTCFilterFunctionNArguments local_28f0;
  undefined1 local_28c0 [32];
  ulong local_2890;
  ulong local_2888;
  ulong local_2880;
  ulong local_2878;
  undefined1 (*local_2870) [16];
  Scene *local_2868;
  long local_2860;
  long local_2858;
  ulong local_2850;
  ulong local_2848;
  ulong local_2840;
  ulong local_2838;
  float local_2830;
  float local_282c;
  float local_2828;
  float local_2824;
  float local_2820;
  undefined4 local_281c;
  uint local_2818;
  uint local_2814;
  uint local_2810;
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [8];
  float fStack_2758;
  float fStack_2754;
  undefined1 local_2750 [8];
  float fStack_2748;
  float fStack_2744;
  undefined1 local_2740 [8];
  float fStack_2738;
  float fStack_2734;
  undefined1 local_2730 [8];
  float fStack_2728;
  float fStack_2724;
  undefined1 local_2720 [8];
  float fStack_2718;
  float fStack_2714;
  undefined1 local_2710 [8];
  float fStack_2708;
  float fStack_2704;
  undefined1 local_2700 [8];
  float fStack_26f8;
  float fStack_26f4;
  undefined1 local_26f0 [8];
  float fStack_26e8;
  float fStack_26e4;
  undefined1 local_26e0 [8];
  float fStack_26d8;
  float fStack_26d4;
  undefined1 local_26d0 [8];
  float fStack_26c8;
  float fStack_26c4;
  undefined1 local_26c0 [8];
  float fStack_26b8;
  float fStack_26b4;
  undefined1 local_26b0 [16];
  undefined1 local_26a0 [32];
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25c0 [32];
  float local_25a0 [4];
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  undefined4 uStack_2584;
  float local_2580 [4];
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  undefined4 uStack_2564;
  undefined1 local_2560 [32];
  float local_2540 [4];
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  float fStack_2524;
  float local_2520 [4];
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  float fStack_2504;
  float local_2500 [4];
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  undefined4 uStack_24e4;
  undefined1 local_24e0 [8];
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  undefined4 uStack_24c4;
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar171 [64];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_2398 = 0;
    if (local_23a0 != 8) {
      aVar5 = (ray->super_RayK<1>).dir.field_0;
      auVar161 = ZEXT816(0) << 0x40;
      auVar182 = ZEXT1664(auVar161);
      auVar143 = vmaxss_avx(auVar161,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar162 = vmaxss_avx(auVar161,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar161._8_4_ = 0x7fffffff;
      auVar161._0_8_ = 0x7fffffff7fffffff;
      auVar161._12_4_ = 0x7fffffff;
      auVar161 = vandps_avx((undefined1  [16])aVar5,auVar161);
      auVar172._8_4_ = 0x219392ef;
      auVar172._0_8_ = 0x219392ef219392ef;
      auVar172._12_4_ = 0x219392ef;
      auVar161 = vcmpps_avx(auVar161,auVar172,1);
      auVar161 = vblendvps_avx((undefined1  [16])aVar5,auVar172,auVar161);
      local_2870 = (undefined1 (*) [16])local_2390;
      auVar172 = vrcpps_avx(auVar161);
      fVar141 = auVar172._0_4_;
      auVar159._0_4_ = auVar161._0_4_ * fVar141;
      fVar153 = auVar172._4_4_;
      auVar159._4_4_ = auVar161._4_4_ * fVar153;
      fVar155 = auVar172._8_4_;
      auVar159._8_4_ = auVar161._8_4_ * fVar155;
      fVar156 = auVar172._12_4_;
      auVar159._12_4_ = auVar161._12_4_ * fVar156;
      auVar173._8_4_ = 0x3f800000;
      auVar173._0_8_ = &DAT_3f8000003f800000;
      auVar173._12_4_ = 0x3f800000;
      auVar161 = vsubps_avx(auVar173,auVar159);
      uVar3 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_23e0._4_4_ = uVar3;
      local_23e0._0_4_ = uVar3;
      local_23e0._8_4_ = uVar3;
      local_23e0._12_4_ = uVar3;
      local_23e0._16_4_ = uVar3;
      local_23e0._20_4_ = uVar3;
      local_23e0._24_4_ = uVar3;
      local_23e0._28_4_ = uVar3;
      auVar184 = ZEXT3264(local_23e0);
      uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_2400._4_4_ = uVar3;
      local_2400._0_4_ = uVar3;
      local_2400._8_4_ = uVar3;
      local_2400._12_4_ = uVar3;
      local_2400._16_4_ = uVar3;
      local_2400._20_4_ = uVar3;
      local_2400._24_4_ = uVar3;
      local_2400._28_4_ = uVar3;
      auVar186 = ZEXT3264(local_2400);
      uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_2420._4_4_ = uVar3;
      local_2420._0_4_ = uVar3;
      local_2420._8_4_ = uVar3;
      local_2420._12_4_ = uVar3;
      local_2420._16_4_ = uVar3;
      local_2420._20_4_ = uVar3;
      local_2420._24_4_ = uVar3;
      local_2420._28_4_ = uVar3;
      auVar191 = ZEXT3264(local_2420);
      auVar160._0_4_ = fVar141 + fVar141 * auVar161._0_4_;
      auVar160._4_4_ = fVar153 + fVar153 * auVar161._4_4_;
      auVar160._8_4_ = fVar155 + fVar155 * auVar161._8_4_;
      auVar160._12_4_ = fVar156 + fVar156 * auVar161._12_4_;
      auVar161 = vshufps_avx(auVar160,auVar160,0);
      local_2440._16_16_ = auVar161;
      local_2440._0_16_ = auVar161;
      auVar200 = ZEXT3264(local_2440);
      auVar161 = vmovshdup_avx(auVar160);
      auVar172 = vshufps_avx(auVar160,auVar160,0x55);
      local_2460._16_16_ = auVar172;
      local_2460._0_16_ = auVar172;
      auVar208 = ZEXT3264(local_2460);
      auVar172 = vshufpd_avx(auVar160,auVar160,1);
      auVar178 = ZEXT1664(auVar172);
      auVar159 = vshufps_avx(auVar160,auVar160,0xaa);
      local_2878 = (ulong)(auVar160._0_4_ < 0.0) << 5;
      local_2480._16_16_ = auVar159;
      local_2480._0_16_ = auVar159;
      auVar209 = ZEXT3264(local_2480);
      uVar118 = (ulong)(auVar161._0_4_ < 0.0) << 5 | 0x40;
      uVar134 = (ulong)(auVar172._0_4_ < 0.0) << 5 | 0x80;
      auVar161 = vshufps_avx(auVar143,auVar143,0);
      local_24a0._16_16_ = auVar161;
      local_24a0._0_16_ = auVar161;
      auVar213 = ZEXT3264(local_24a0);
      auVar161 = vshufps_avx(auVar162,auVar162,0);
      local_26a0._16_16_ = mm_lookupmask_ps._240_16_;
      local_26a0._0_16_ = mm_lookupmask_ps._240_16_;
      local_24c0 = vperm2f128_avx(local_26a0,mm_lookupmask_ps._0_32_,2);
      auVar140 = ZEXT3264(CONCAT1616(auVar161,auVar161));
      auVar144._8_4_ = 0xbf800000;
      auVar144._0_8_ = 0xbf800000bf800000;
      auVar144._12_4_ = 0xbf800000;
      auVar144._16_4_ = 0xbf800000;
      auVar144._20_4_ = 0xbf800000;
      auVar144._24_4_ = 0xbf800000;
      auVar144._28_4_ = 0xbf800000;
      auVar168._8_4_ = 0x3f800000;
      auVar168._0_8_ = &DAT_3f8000003f800000;
      auVar168._12_4_ = 0x3f800000;
      auVar168._16_4_ = 0x3f800000;
      auVar168._20_4_ = 0x3f800000;
      auVar168._24_4_ = 0x3f800000;
      auVar168._28_4_ = 0x3f800000;
      auVar171 = ZEXT3264(auVar168);
      _local_24e0 = vblendvps_avx(auVar168,auVar144,local_24c0);
      local_2880 = uVar118;
      local_2888 = uVar134;
      local_2890 = local_2878 ^ 0x20;
      uVar117 = uVar118;
      uVar122 = local_2878;
      uVar123 = local_2878 ^ 0x20;
      uVar124 = uVar134;
      do {
        do {
          fVar141 = (ray->super_RayK<1>).tfar;
          auVar150 = ZEXT464((uint)fVar141);
          do {
            if (local_2870 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            pauVar129 = local_2870 + -1;
            local_2870 = local_2870 + -1;
          } while (fVar141 < *(float *)(*pauVar129 + 8));
          uVar132 = *(ulong *)*local_2870;
          do {
            auVar146 = auVar191._0_32_;
            auVar168 = auVar186._0_32_;
            auVar144 = auVar184._0_32_;
            if ((uVar132 & 8) == 0) {
              uVar113 = uVar132 & 0xfffffffffffffff0;
              fVar141 = (ray->super_RayK<1>).dir.field_0.m128[3];
              auVar164._4_4_ = fVar141;
              auVar164._0_4_ = fVar141;
              auVar164._8_4_ = fVar141;
              auVar164._12_4_ = fVar141;
              auVar164._16_4_ = fVar141;
              auVar164._20_4_ = fVar141;
              auVar164._24_4_ = fVar141;
              auVar164._28_4_ = fVar141;
              pfVar2 = (float *)(uVar113 + 0x100 + uVar122);
              pfVar1 = (float *)(uVar113 + 0x40 + uVar122);
              auVar145._0_4_ = fVar141 * *pfVar2 + *pfVar1;
              auVar145._4_4_ = fVar141 * pfVar2[1] + pfVar1[1];
              auVar145._8_4_ = fVar141 * pfVar2[2] + pfVar1[2];
              auVar145._12_4_ = fVar141 * pfVar2[3] + pfVar1[3];
              auVar145._16_4_ = fVar141 * pfVar2[4] + pfVar1[4];
              auVar145._20_4_ = fVar141 * pfVar2[5] + pfVar1[5];
              auVar145._24_4_ = fVar141 * pfVar2[6] + pfVar1[6];
              auVar145._28_4_ = auVar150._28_4_ + pfVar1[7];
              auVar145 = vsubps_avx(auVar145,auVar144);
              auVar77._4_4_ = auVar200._4_4_ * auVar145._4_4_;
              auVar77._0_4_ = auVar200._0_4_ * auVar145._0_4_;
              auVar77._8_4_ = auVar200._8_4_ * auVar145._8_4_;
              auVar77._12_4_ = auVar200._12_4_ * auVar145._12_4_;
              auVar77._16_4_ = auVar200._16_4_ * auVar145._16_4_;
              auVar77._20_4_ = auVar200._20_4_ * auVar145._20_4_;
              auVar77._24_4_ = auVar200._24_4_ * auVar145._24_4_;
              auVar77._28_4_ = auVar145._28_4_;
              pfVar2 = (float *)(uVar113 + 0x100 + uVar117);
              pfVar1 = (float *)(uVar113 + 0x40 + uVar117);
              auVar169._0_4_ = fVar141 * *pfVar2 + *pfVar1;
              auVar169._4_4_ = fVar141 * pfVar2[1] + pfVar1[1];
              auVar169._8_4_ = fVar141 * pfVar2[2] + pfVar1[2];
              auVar169._12_4_ = fVar141 * pfVar2[3] + pfVar1[3];
              auVar169._16_4_ = fVar141 * pfVar2[4] + pfVar1[4];
              auVar169._20_4_ = fVar141 * pfVar2[5] + pfVar1[5];
              auVar169._24_4_ = fVar141 * pfVar2[6] + pfVar1[6];
              auVar169._28_4_ = auVar171._28_4_ + pfVar1[7];
              auVar145 = vmaxps_avx(auVar213._0_32_,auVar77);
              auVar77 = vsubps_avx(auVar169,auVar168);
              pfVar2 = (float *)(uVar113 + 0x100 + uVar124);
              auVar78._4_4_ = auVar208._4_4_ * auVar77._4_4_;
              auVar78._0_4_ = auVar208._0_4_ * auVar77._0_4_;
              auVar78._8_4_ = auVar208._8_4_ * auVar77._8_4_;
              auVar78._12_4_ = auVar208._12_4_ * auVar77._12_4_;
              auVar78._16_4_ = auVar208._16_4_ * auVar77._16_4_;
              auVar78._20_4_ = auVar208._20_4_ * auVar77._20_4_;
              auVar78._24_4_ = auVar208._24_4_ * auVar77._24_4_;
              auVar78._28_4_ = auVar77._28_4_;
              pfVar1 = (float *)(uVar113 + 0x40 + uVar124);
              auVar175._0_4_ = fVar141 * *pfVar2 + *pfVar1;
              auVar175._4_4_ = fVar141 * pfVar2[1] + pfVar1[1];
              auVar175._8_4_ = fVar141 * pfVar2[2] + pfVar1[2];
              auVar175._12_4_ = fVar141 * pfVar2[3] + pfVar1[3];
              auVar175._16_4_ = fVar141 * pfVar2[4] + pfVar1[4];
              auVar175._20_4_ = fVar141 * pfVar2[5] + pfVar1[5];
              auVar175._24_4_ = fVar141 * pfVar2[6] + pfVar1[6];
              auVar175._28_4_ = auVar178._28_4_ + pfVar1[7];
              auVar77 = vsubps_avx(auVar175,auVar146);
              auVar79._4_4_ = auVar209._4_4_ * auVar77._4_4_;
              auVar79._0_4_ = auVar209._0_4_ * auVar77._0_4_;
              auVar79._8_4_ = auVar209._8_4_ * auVar77._8_4_;
              auVar79._12_4_ = auVar209._12_4_ * auVar77._12_4_;
              auVar79._16_4_ = auVar209._16_4_ * auVar77._16_4_;
              auVar79._20_4_ = auVar209._20_4_ * auVar77._20_4_;
              fVar153 = auVar77._28_4_;
              auVar79._24_4_ = auVar209._24_4_ * auVar77._24_4_;
              auVar79._28_4_ = fVar153;
              auVar77 = vmaxps_avx(auVar78,auVar79);
              pfVar2 = (float *)(uVar113 + 0x100 + uVar123);
              local_2660 = vmaxps_avx(auVar145,auVar77);
              auVar150 = ZEXT3264(local_2660);
              pfVar1 = (float *)(uVar113 + 0x40 + uVar123);
              auVar170._0_4_ = fVar141 * *pfVar2 + *pfVar1;
              auVar170._4_4_ = fVar141 * pfVar2[1] + pfVar1[1];
              auVar170._8_4_ = fVar141 * pfVar2[2] + pfVar1[2];
              auVar170._12_4_ = fVar141 * pfVar2[3] + pfVar1[3];
              auVar170._16_4_ = fVar141 * pfVar2[4] + pfVar1[4];
              auVar170._20_4_ = fVar141 * pfVar2[5] + pfVar1[5];
              auVar170._24_4_ = fVar141 * pfVar2[6] + pfVar1[6];
              auVar170._28_4_ = fVar153 + pfVar1[7];
              auVar145 = vsubps_avx(auVar170,auVar144);
              pfVar2 = (float *)(uVar113 + 0x100 + (uVar118 ^ 0x20));
              pfVar1 = (float *)(uVar113 + 0x40 + (uVar118 ^ 0x20));
              auVar176._0_4_ = fVar141 * *pfVar2 + *pfVar1;
              auVar176._4_4_ = fVar141 * pfVar2[1] + pfVar1[1];
              auVar176._8_4_ = fVar141 * pfVar2[2] + pfVar1[2];
              auVar176._12_4_ = fVar141 * pfVar2[3] + pfVar1[3];
              auVar176._16_4_ = fVar141 * pfVar2[4] + pfVar1[4];
              auVar176._20_4_ = fVar141 * pfVar2[5] + pfVar1[5];
              auVar176._24_4_ = fVar141 * pfVar2[6] + pfVar1[6];
              auVar176._28_4_ = fVar153 + pfVar1[7];
              auVar82._4_4_ = auVar200._4_4_ * auVar145._4_4_;
              auVar82._0_4_ = auVar200._0_4_ * auVar145._0_4_;
              auVar82._8_4_ = auVar200._8_4_ * auVar145._8_4_;
              auVar82._12_4_ = auVar200._12_4_ * auVar145._12_4_;
              auVar82._16_4_ = auVar200._16_4_ * auVar145._16_4_;
              auVar82._20_4_ = auVar200._20_4_ * auVar145._20_4_;
              auVar82._24_4_ = auVar200._24_4_ * auVar145._24_4_;
              auVar82._28_4_ = auVar145._28_4_;
              auVar145 = vsubps_avx(auVar176,auVar168);
              pfVar2 = (float *)(uVar113 + 0x100 + (uVar134 ^ 0x20));
              auVar83._4_4_ = auVar208._4_4_ * auVar145._4_4_;
              auVar83._0_4_ = auVar208._0_4_ * auVar145._0_4_;
              auVar83._8_4_ = auVar208._8_4_ * auVar145._8_4_;
              auVar83._12_4_ = auVar208._12_4_ * auVar145._12_4_;
              auVar83._16_4_ = auVar208._16_4_ * auVar145._16_4_;
              auVar83._20_4_ = auVar208._20_4_ * auVar145._20_4_;
              auVar83._24_4_ = auVar208._24_4_ * auVar145._24_4_;
              auVar83._28_4_ = auVar145._28_4_;
              pfVar1 = (float *)(uVar113 + 0x40 + (uVar134 ^ 0x20));
              auVar179._0_4_ = fVar141 * *pfVar2 + *pfVar1;
              auVar179._4_4_ = fVar141 * pfVar2[1] + pfVar1[1];
              auVar179._8_4_ = fVar141 * pfVar2[2] + pfVar1[2];
              auVar179._12_4_ = fVar141 * pfVar2[3] + pfVar1[3];
              auVar179._16_4_ = fVar141 * pfVar2[4] + pfVar1[4];
              auVar179._20_4_ = fVar141 * pfVar2[5] + pfVar1[5];
              auVar179._24_4_ = fVar141 * pfVar2[6] + pfVar1[6];
              auVar179._28_4_ = auVar182._28_4_ + pfVar1[7];
              auVar145 = vsubps_avx(auVar179,auVar146);
              auVar84._4_4_ = auVar209._4_4_ * auVar145._4_4_;
              auVar84._0_4_ = auVar209._0_4_ * auVar145._0_4_;
              auVar84._8_4_ = auVar209._8_4_ * auVar145._8_4_;
              auVar84._12_4_ = auVar209._12_4_ * auVar145._12_4_;
              auVar84._16_4_ = auVar209._16_4_ * auVar145._16_4_;
              auVar84._20_4_ = auVar209._20_4_ * auVar145._20_4_;
              auVar84._24_4_ = auVar209._24_4_ * auVar145._24_4_;
              auVar84._28_4_ = auVar145._28_4_;
              auVar182 = ZEXT3264(auVar84);
              auVar77 = vminps_avx(auVar83,auVar84);
              auVar145 = vminps_avx(auVar140._0_32_,auVar82);
              auVar145 = vminps_avx(auVar145,auVar77);
              auVar145 = vcmpps_avx(local_2660,auVar145,2);
              auVar171 = ZEXT3264(auVar145);
              if (((uint)uVar132 & 7) == 6) {
                auVar77 = vcmpps_avx(*(undefined1 (*) [32])(uVar113 + 0x1c0),auVar164,2);
                auVar78 = vcmpps_avx(auVar164,*(undefined1 (*) [32])(uVar113 + 0x1e0),1);
                auVar78 = vandps_avx(auVar77,auVar78);
                auVar145 = vandps_avx(auVar78,auVar145);
                auVar171 = ZEXT1664(auVar145._16_16_);
                auVar161 = vpackssdw_avx(auVar145._0_16_,auVar145._16_16_);
              }
              else {
                auVar161 = vpackssdw_avx(auVar145._0_16_,auVar145._16_16_);
              }
              auVar178 = ZEXT3264(auVar77);
              auVar161 = vpsllw_avx(auVar161,0xf);
              auVar161 = vpacksswb_avx(auVar161,auVar161);
              in_R9 = (ulong)(byte)(SUB161(auVar161 >> 7,0) & 1 |
                                    (SUB161(auVar161 >> 0xf,0) & 1) << 1 |
                                    (SUB161(auVar161 >> 0x17,0) & 1) << 2 |
                                    (SUB161(auVar161 >> 0x1f,0) & 1) << 3 |
                                    (SUB161(auVar161 >> 0x27,0) & 1) << 4 |
                                    (SUB161(auVar161 >> 0x2f,0) & 1) << 5 |
                                    (SUB161(auVar161 >> 0x37,0) & 1) << 6 |
                                   SUB161(auVar161 >> 0x3f,0) << 7);
            }
            if ((uVar132 & 8) == 0) {
              if (in_R9 == 0) {
                iVar116 = 4;
              }
              else {
                uVar113 = uVar132 & 0xfffffffffffffff0;
                lVar115 = 0;
                if (in_R9 != 0) {
                  for (; (in_R9 >> lVar115 & 1) == 0; lVar115 = lVar115 + 1) {
                  }
                }
                iVar116 = 0;
                uVar132 = *(ulong *)(uVar113 + lVar115 * 8);
                uVar126 = in_R9 - 1 & in_R9;
                if (uVar126 != 0) {
                  uVar198 = *(uint *)(local_2660 + lVar115 * 4);
                  lVar115 = 0;
                  if (uVar126 != 0) {
                    for (; (uVar126 >> lVar115 & 1) == 0; lVar115 = lVar115 + 1) {
                    }
                  }
                  uVar125 = *(ulong *)(uVar113 + lVar115 * 8);
                  uVar112 = *(uint *)(local_2660 + lVar115 * 4);
                  uVar126 = uVar126 - 1 & uVar126;
                  if (uVar126 == 0) {
                    if (uVar198 < uVar112) {
                      *(ulong *)*local_2870 = uVar125;
                      *(uint *)(*local_2870 + 8) = uVar112;
                      local_2870 = local_2870 + 1;
                    }
                    else {
                      *(ulong *)*local_2870 = uVar132;
                      *(uint *)(*local_2870 + 8) = uVar198;
                      local_2870 = local_2870 + 1;
                      uVar132 = uVar125;
                    }
                  }
                  else {
                    auVar143._8_8_ = 0;
                    auVar143._0_8_ = uVar132;
                    auVar161 = vpunpcklqdq_avx(auVar143,ZEXT416(uVar198));
                    auVar162._8_8_ = 0;
                    auVar162._0_8_ = uVar125;
                    auVar143 = vpunpcklqdq_avx(auVar162,ZEXT416(uVar112));
                    lVar115 = 0;
                    if (uVar126 != 0) {
                      for (; (uVar126 >> lVar115 & 1) == 0; lVar115 = lVar115 + 1) {
                      }
                    }
                    auVar167._8_8_ = 0;
                    auVar167._0_8_ = *(ulong *)(uVar113 + lVar115 * 8);
                    auVar162 = vpunpcklqdq_avx(auVar167,ZEXT416(*(uint *)(local_2660 + lVar115 * 4))
                                              );
                    uVar126 = uVar126 - 1 & uVar126;
                    if (uVar126 == 0) {
                      auVar172 = vpcmpgtd_avx(auVar143,auVar161);
                      auVar159 = vpshufd_avx(auVar172,0xaa);
                      auVar172 = vblendvps_avx(auVar143,auVar161,auVar159);
                      auVar161 = vblendvps_avx(auVar161,auVar143,auVar159);
                      auVar143 = vpcmpgtd_avx(auVar162,auVar172);
                      auVar159 = vpshufd_avx(auVar143,0xaa);
                      auVar143 = vblendvps_avx(auVar162,auVar172,auVar159);
                      auVar178 = ZEXT1664(auVar143);
                      auVar162 = vblendvps_avx(auVar172,auVar162,auVar159);
                      auVar172 = vpcmpgtd_avx(auVar162,auVar161);
                      auVar159 = vpshufd_avx(auVar172,0xaa);
                      auVar171 = ZEXT1664(auVar159);
                      auVar172 = vblendvps_avx(auVar162,auVar161,auVar159);
                      auVar182 = ZEXT1664(auVar172);
                      auVar161 = vblendvps_avx(auVar161,auVar162,auVar159);
                      auVar150 = ZEXT1664(auVar161);
                      *local_2870 = auVar161;
                      local_2870[1] = auVar172;
                      uVar132 = auVar143._0_8_;
                      local_2870 = local_2870 + 2;
                    }
                    else {
                      lVar115 = 0;
                      if (uVar126 != 0) {
                        for (; (uVar126 >> lVar115 & 1) == 0; lVar115 = lVar115 + 1) {
                        }
                      }
                      auVar182 = ZEXT464(*(uint *)(local_2660 + lVar115 * 4));
                      auVar174._8_8_ = 0;
                      auVar174._0_8_ = *(ulong *)(uVar113 + lVar115 * 8);
                      auVar172 = vpunpcklqdq_avx(auVar174,ZEXT416(*(uint *)(local_2660 + lVar115 * 4
                                                                           )));
                      uVar126 = uVar126 - 1 & uVar126;
                      if (uVar126 == 0) {
                        auVar159 = vpcmpgtd_avx(auVar143,auVar161);
                        auVar160 = vpshufd_avx(auVar159,0xaa);
                        auVar159 = vblendvps_avx(auVar143,auVar161,auVar160);
                        auVar161 = vblendvps_avx(auVar161,auVar143,auVar160);
                        auVar143 = vpcmpgtd_avx(auVar172,auVar162);
                        auVar160 = vpshufd_avx(auVar143,0xaa);
                        auVar143 = vblendvps_avx(auVar172,auVar162,auVar160);
                        auVar162 = vblendvps_avx(auVar162,auVar172,auVar160);
                        auVar172 = vpcmpgtd_avx(auVar162,auVar161);
                        auVar160 = vpshufd_avx(auVar172,0xaa);
                        auVar172 = vblendvps_avx(auVar162,auVar161,auVar160);
                        auVar161 = vblendvps_avx(auVar161,auVar162,auVar160);
                        auVar162 = vpcmpgtd_avx(auVar143,auVar159);
                        auVar160 = vpshufd_avx(auVar162,0xaa);
                        auVar162 = vblendvps_avx(auVar143,auVar159,auVar160);
                        auVar143 = vblendvps_avx(auVar159,auVar143,auVar160);
                        auVar159 = vpcmpgtd_avx(auVar172,auVar143);
                        auVar160 = vpshufd_avx(auVar159,0xaa);
                        auVar182 = ZEXT1664(auVar160);
                        auVar159 = vblendvps_avx(auVar172,auVar143,auVar160);
                        auVar143 = vblendvps_avx(auVar143,auVar172,auVar160);
                        *local_2870 = auVar161;
                        local_2870[1] = auVar143;
                        local_2870[2] = auVar159;
                        uVar132 = auVar162._0_8_;
                        pauVar129 = local_2870 + 3;
                      }
                      else {
                        *local_2870 = auVar161;
                        local_2870[1] = auVar143;
                        local_2870[2] = auVar162;
                        local_2870[3] = auVar172;
                        lVar115 = 0x30;
                        do {
                          lVar120 = lVar115;
                          lVar115 = 0;
                          if (uVar126 != 0) {
                            for (; (uVar126 >> lVar115 & 1) == 0; lVar115 = lVar115 + 1) {
                            }
                          }
                          auVar142._8_8_ = 0;
                          auVar142._0_8_ = *(ulong *)(uVar113 + lVar115 * 8);
                          auVar161 = vpunpcklqdq_avx(auVar142,ZEXT416(*(uint *)(local_2660 +
                                                                               lVar115 * 4)));
                          *(undefined1 (*) [16])(local_2870[1] + lVar120) = auVar161;
                          uVar126 = uVar126 & uVar126 - 1;
                          lVar115 = lVar120 + 0x10;
                        } while (uVar126 != 0);
                        pauVar129 = (undefined1 (*) [16])(local_2870[1] + lVar120);
                        if (lVar120 + 0x10 != 0) {
                          lVar115 = 0x10;
                          pauVar119 = local_2870;
                          do {
                            auVar161 = pauVar119[1];
                            uVar198 = *(uint *)(pauVar119[1] + 8);
                            pauVar119 = pauVar119 + 1;
                            lVar120 = lVar115;
                            do {
                              if (uVar198 <= *(uint *)(local_2870[-1] + lVar120 + 8)) {
                                pauVar121 = (undefined1 (*) [16])(*local_2870 + lVar120);
                                break;
                              }
                              *(undefined1 (*) [16])(*local_2870 + lVar120) =
                                   *(undefined1 (*) [16])(local_2870[-1] + lVar120);
                              lVar120 = lVar120 + -0x10;
                              pauVar121 = local_2870;
                            } while (lVar120 != 0);
                            *pauVar121 = auVar161;
                            lVar115 = lVar115 + 0x10;
                          } while (pauVar129 != pauVar119);
                        }
                        uVar132 = *(ulong *)*pauVar129;
                      }
                      auVar150 = ZEXT1664(auVar161);
                      auVar178 = ZEXT1664(auVar172);
                      auVar171 = ZEXT1664(auVar162);
                      auVar184 = ZEXT3264(auVar144);
                      auVar186 = ZEXT3264(auVar168);
                      auVar191 = ZEXT3264(auVar146);
                      auVar200 = ZEXT3264(auVar200._0_32_);
                      auVar208 = ZEXT3264(auVar208._0_32_);
                      auVar209 = ZEXT3264(auVar209._0_32_);
                      auVar213 = ZEXT3264(auVar213._0_32_);
                      local_2870 = pauVar129;
                    }
                  }
                }
              }
            }
            else {
              iVar116 = 6;
            }
          } while (iVar116 == 0);
        } while (iVar116 != 6);
        local_2860 = (ulong)((uint)uVar132 & 0xf) - 8;
        if (local_2860 != 0) {
          uVar132 = uVar132 & 0xfffffffffffffff0;
          lVar115 = 0;
          do {
            lVar114 = lVar115 * 0x60;
            pSVar6 = context->scene;
            local_2868 = pSVar6;
            pRVar7 = (pSVar6->geometries).items;
            pGVar8 = pRVar7[*(uint *)(uVar132 + 0x40 + lVar114)].ptr;
            fVar141 = (pGVar8->time_range).lower;
            fVar141 = pGVar8->fnumTimeSegments *
                      (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar141) /
                      ((pGVar8->time_range).upper - fVar141));
            auVar161 = vroundss_avx(ZEXT416((uint)fVar141),ZEXT416((uint)fVar141),9);
            auVar161 = vminss_avx(auVar161,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
            auVar211 = vmaxss_avx(ZEXT816(0) << 0x20,auVar161);
            iVar116 = (int)auVar211._0_4_;
            lVar127 = (long)iVar116 * 0x38;
            lVar120 = *(long *)(*(long *)&pGVar8[2].numPrimitives + lVar127);
            local_2848 = (ulong)*(uint *)(uVar132 + 4 + lVar114);
            auVar161 = *(undefined1 (*) [16])(lVar120 + (ulong)*(uint *)(uVar132 + lVar114) * 4);
            uVar122 = (ulong)*(uint *)(uVar132 + 0x10 + lVar114);
            auVar143 = *(undefined1 (*) [16])(lVar120 + uVar122 * 4);
            uVar123 = (ulong)*(uint *)(uVar132 + 0x20 + lVar114);
            auVar162 = *(undefined1 (*) [16])(lVar120 + uVar123 * 4);
            uVar124 = (ulong)*(uint *)(uVar132 + 0x30 + lVar114);
            auVar172 = *(undefined1 (*) [16])(lVar120 + uVar124 * 4);
            local_2858 = *(long *)&pRVar7[*(uint *)(uVar132 + 0x44 + lVar114)].ptr[2].numPrimitives;
            lVar120 = *(long *)(local_2858 + lVar127);
            auVar159 = *(undefined1 (*) [16])(lVar120 + local_2848 * 4);
            local_2838 = (ulong)*(uint *)(uVar132 + 0x14 + lVar114);
            auVar160 = *(undefined1 (*) [16])(lVar120 + local_2838 * 4);
            uVar113 = (ulong)*(uint *)(uVar132 + 0x24 + lVar114);
            auVar173 = *(undefined1 (*) [16])(lVar120 + uVar113 * 4);
            uVar126 = (ulong)*(uint *)(uVar132 + 0x34 + lVar114);
            auVar167 = *(undefined1 (*) [16])(lVar120 + uVar126 * 4);
            lVar120 = *(long *)&pRVar7[*(uint *)(uVar132 + 0x48 + lVar114)].ptr[2].numPrimitives;
            lVar9 = *(long *)(lVar120 + lVar127);
            uVar125 = (ulong)*(uint *)(uVar132 + 8 + lVar114);
            auVar174 = *(undefined1 (*) [16])(lVar9 + uVar125 * 4);
            uVar135 = (ulong)*(uint *)(uVar132 + 0x18 + lVar114);
            auVar142 = *(undefined1 (*) [16])(lVar9 + uVar135 * 4);
            local_2850 = (ulong)*(uint *)(uVar132 + 0x28 + lVar114);
            auVar136 = *(undefined1 (*) [16])(lVar9 + local_2850 * 4);
            local_2840 = (ulong)*(uint *)(uVar132 + 0x38 + lVar114);
            auVar163 = *(undefined1 (*) [16])(lVar9 + local_2840 * 4);
            fVar141 = fVar141 - auVar211._0_4_;
            local_26b0 = ZEXT416((uint)fVar141);
            lVar9 = *(long *)&pRVar7[*(uint *)(uVar132 + 0x4c + lVar114)].ptr[2].numPrimitives;
            lVar127 = *(long *)(lVar9 + lVar127);
            uVar117 = (ulong)*(uint *)(uVar132 + 0xc + lVar114);
            auVar211 = *(undefined1 (*) [16])(lVar127 + uVar117 * 4);
            uVar131 = (ulong)*(uint *)(uVar132 + 0x1c + lVar114);
            auVar223 = *(undefined1 (*) [16])(lVar127 + uVar131 * 4);
            auVar188 = vunpcklps_avx(auVar161,auVar174);
            auVar174 = vunpckhps_avx(auVar161,auVar174);
            auVar80 = vunpcklps_avx(auVar159,auVar211);
            auVar159 = vunpckhps_avx(auVar159,auVar211);
            uVar128 = (ulong)*(uint *)(uVar132 + 0x2c + lVar114);
            auVar161 = *(undefined1 (*) [16])(lVar127 + uVar128 * 4);
            _local_26d0 = vunpcklps_avx(auVar174,auVar159);
            auVar110 = _local_26d0;
            _local_2710 = vunpcklps_avx(auVar188,auVar80);
            auVar106 = _local_2710;
            _local_26f0 = vunpckhps_avx(auVar188,auVar80);
            auVar108 = _local_26f0;
            auVar174 = vunpcklps_avx(auVar143,auVar142);
            auVar159 = vunpckhps_avx(auVar143,auVar142);
            auVar142 = vunpcklps_avx(auVar160,auVar223);
            auVar160 = vunpckhps_avx(auVar160,auVar223);
            uVar130 = (ulong)*(uint *)(uVar132 + 0x3c + lVar114);
            auVar143 = *(undefined1 (*) [16])(lVar127 + uVar130 * 4);
            _local_26c0 = vunpcklps_avx(auVar159,auVar160);
            auVar111 = _local_26c0;
            _local_2700 = vunpcklps_avx(auVar174,auVar142);
            auVar107 = _local_2700;
            _local_26e0 = vunpckhps_avx(auVar174,auVar142);
            auVar109 = _local_26e0;
            auVar160 = vunpcklps_avx(auVar162,auVar136);
            auVar162 = vunpckhps_avx(auVar162,auVar136);
            auVar174 = vunpcklps_avx(auVar173,auVar161);
            auVar159 = vunpckhps_avx(auVar173,auVar161);
            lVar133 = (long)(iVar116 + 1) * 0x38;
            lVar127 = *(long *)(*(long *)&pGVar8[2].numPrimitives + lVar133);
            auVar161 = *(undefined1 (*) [16])(lVar127 + (ulong)*(uint *)(uVar132 + lVar114) * 4);
            _local_2720 = vunpcklps_avx(auVar162,auVar159);
            auVar105 = _local_2720;
            _local_2760 = vunpcklps_avx(auVar160,auVar174);
            auVar101 = _local_2760;
            _local_2740 = vunpckhps_avx(auVar160,auVar174);
            auVar103 = _local_2740;
            auVar159 = vunpcklps_avx(auVar172,auVar163);
            auVar162 = vunpckhps_avx(auVar172,auVar163);
            auVar160 = vunpcklps_avx(auVar167,auVar143);
            auVar172 = vunpckhps_avx(auVar167,auVar143);
            lVar120 = *(long *)(lVar120 + lVar133);
            auVar143 = *(undefined1 (*) [16])(lVar120 + uVar125 * 4);
            _local_2730 = vunpcklps_avx(auVar162,auVar172);
            auVar104 = _local_2730;
            auVar173 = vunpcklps_avx(auVar159,auVar160);
            _local_2750 = vunpckhps_avx(auVar159,auVar160);
            auVar102 = _local_2750;
            lVar10 = *(long *)(local_2858 + lVar133);
            auVar172 = vunpcklps_avx(auVar161,auVar143);
            auVar162 = vunpckhps_avx(auVar161,auVar143);
            auVar161 = *(undefined1 (*) [16])(lVar10 + local_2848 * 4);
            lVar9 = *(long *)(lVar9 + lVar133);
            auVar143 = *(undefined1 (*) [16])(lVar9 + uVar117 * 4);
            auVar159 = vunpcklps_avx(auVar161,auVar143);
            auVar161 = vunpckhps_avx(auVar161,auVar143);
            auVar167 = vunpcklps_avx(auVar162,auVar161);
            auVar174 = vunpcklps_avx(auVar172,auVar159);
            auVar162 = vunpckhps_avx(auVar172,auVar159);
            auVar161 = *(undefined1 (*) [16])(lVar127 + uVar122 * 4);
            auVar143 = *(undefined1 (*) [16])(lVar120 + uVar135 * 4);
            auVar159 = vunpcklps_avx(auVar161,auVar143);
            auVar172 = vunpckhps_avx(auVar161,auVar143);
            auVar161 = *(undefined1 (*) [16])(lVar10 + local_2838 * 4);
            auVar143 = *(undefined1 (*) [16])(lVar9 + uVar131 * 4);
            auVar160 = vunpcklps_avx(auVar161,auVar143);
            auVar161 = vunpckhps_avx(auVar161,auVar143);
            auVar142 = vunpcklps_avx(auVar172,auVar161);
            auVar136 = vunpcklps_avx(auVar159,auVar160);
            auVar172 = vunpckhps_avx(auVar159,auVar160);
            auVar161 = *(undefined1 (*) [16])(lVar127 + uVar123 * 4);
            auVar143 = *(undefined1 (*) [16])(lVar120 + local_2850 * 4);
            auVar160 = vunpcklps_avx(auVar161,auVar143);
            auVar159 = vunpckhps_avx(auVar161,auVar143);
            auVar161 = *(undefined1 (*) [16])(lVar10 + uVar113 * 4);
            auVar143 = *(undefined1 (*) [16])(lVar9 + uVar128 * 4);
            auVar163 = vunpcklps_avx(auVar161,auVar143);
            auVar161 = vunpckhps_avx(auVar161,auVar143);
            auVar211 = vunpcklps_avx(auVar159,auVar161);
            auVar223 = vunpcklps_avx(auVar160,auVar163);
            auVar159 = vunpckhps_avx(auVar160,auVar163);
            auVar161 = *(undefined1 (*) [16])(lVar127 + uVar124 * 4);
            auVar143 = *(undefined1 (*) [16])(lVar120 + local_2840 * 4);
            auVar163 = vunpcklps_avx(auVar161,auVar143);
            auVar160 = vunpckhps_avx(auVar161,auVar143);
            auVar161 = *(undefined1 (*) [16])(lVar10 + uVar126 * 4);
            auVar143 = *(undefined1 (*) [16])(lVar9 + uVar130 * 4);
            auVar188 = vunpcklps_avx(auVar161,auVar143);
            auVar161 = vunpckhps_avx(auVar161,auVar143);
            auVar80 = vunpcklps_avx(auVar160,auVar161);
            auVar81 = vunpcklps_avx(auVar163,auVar188);
            auVar160 = vunpckhps_avx(auVar163,auVar188);
            auVar161 = vshufps_avx(local_26b0,local_26b0,0);
            auVar143 = ZEXT416((uint)(1.0 - fVar141));
            auVar143 = vshufps_avx(auVar143,auVar143,0);
            fVar141 = auVar161._0_4_;
            fVar153 = auVar161._4_4_;
            fVar155 = auVar161._8_4_;
            fVar156 = auVar161._12_4_;
            fVar157 = auVar143._0_4_;
            fVar158 = auVar143._4_4_;
            fVar152 = auVar143._8_4_;
            fVar154 = auVar143._12_4_;
            auVar177._4_4_ = fVar158 * (float)local_2710._4_4_ + auVar174._4_4_ * fVar153;
            auVar177._0_4_ = fVar157 * (float)local_2710._0_4_ + auVar174._0_4_ * fVar141;
            auVar177._8_4_ = fVar152 * fStack_2708 + auVar174._8_4_ * fVar155;
            auVar177._12_4_ = fVar154 * fStack_2704 + auVar174._12_4_ * fVar156;
            auVar180._4_4_ = fVar158 * (float)local_26f0._4_4_ + auVar162._4_4_ * fVar153;
            auVar180._0_4_ = fVar157 * (float)local_26f0._0_4_ + auVar162._0_4_ * fVar141;
            auVar180._8_4_ = fVar152 * fStack_26e8 + auVar162._8_4_ * fVar155;
            auVar180._12_4_ = fVar154 * fStack_26e4 + auVar162._12_4_ * fVar156;
            auVar185._4_4_ = fVar158 * (float)local_26d0._4_4_ + auVar167._4_4_ * fVar153;
            auVar185._0_4_ = fVar157 * (float)local_26d0._0_4_ + auVar167._0_4_ * fVar141;
            auVar185._8_4_ = fVar152 * fStack_26c8 + auVar167._8_4_ * fVar155;
            auVar185._12_4_ = fVar154 * fStack_26c4 + auVar167._12_4_ * fVar156;
            auVar188._0_4_ = fVar157 * (float)local_2700._0_4_ + fVar141 * auVar136._0_4_;
            auVar188._4_4_ = fVar158 * (float)local_2700._4_4_ + fVar153 * auVar136._4_4_;
            auVar188._8_4_ = fVar152 * fStack_26f8 + fVar155 * auVar136._8_4_;
            auVar188._12_4_ = fVar154 * fStack_26f4 + fVar156 * auVar136._12_4_;
            auVar163._0_4_ = fVar157 * (float)local_26e0._0_4_ + fVar141 * auVar172._0_4_;
            auVar163._4_4_ = fVar158 * (float)local_26e0._4_4_ + fVar153 * auVar172._4_4_;
            auVar163._8_4_ = fVar152 * fStack_26d8 + fVar155 * auVar172._8_4_;
            auVar163._12_4_ = fVar154 * fStack_26d4 + fVar156 * auVar172._12_4_;
            auVar221._0_4_ = fVar157 * (float)local_26c0._0_4_ + auVar142._0_4_ * fVar141;
            auVar221._4_4_ = fVar158 * (float)local_26c0._4_4_ + auVar142._4_4_ * fVar153;
            auVar221._8_4_ = fVar152 * fStack_26b8 + auVar142._8_4_ * fVar155;
            auVar221._12_4_ = fVar154 * fStack_26b4 + auVar142._12_4_ * fVar156;
            auVar177._20_4_ = fVar158 * (float)local_2760._4_4_ + fVar153 * auVar223._4_4_;
            auVar177._16_4_ = fVar157 * (float)local_2760._0_4_ + fVar141 * auVar223._0_4_;
            auVar177._24_4_ = fVar152 * fStack_2758 + fVar155 * auVar223._8_4_;
            auVar177._28_4_ = fVar154 * fStack_2754 + fVar156 * auVar223._12_4_;
            auVar180._20_4_ = fVar158 * (float)local_2740._4_4_ + auVar159._4_4_ * fVar153;
            auVar180._16_4_ = fVar157 * (float)local_2740._0_4_ + auVar159._0_4_ * fVar141;
            auVar180._24_4_ = fVar152 * fStack_2738 + auVar159._8_4_ * fVar155;
            auVar180._28_4_ = fVar154 * fStack_2734 + auVar159._12_4_ * fVar156;
            auVar185._20_4_ = fVar158 * (float)local_2720._4_4_ + auVar211._4_4_ * fVar153;
            auVar185._16_4_ = fVar157 * (float)local_2720._0_4_ + auVar211._0_4_ * fVar141;
            auVar185._24_4_ = fVar152 * fStack_2718 + auVar211._8_4_ * fVar155;
            auVar185._28_4_ = fVar154 * fStack_2714 + auVar211._12_4_ * fVar156;
            auVar223._0_4_ = auVar173._0_4_ * fVar157 + fVar141 * auVar81._0_4_;
            auVar223._4_4_ = auVar173._4_4_ * fVar158 + fVar153 * auVar81._4_4_;
            auVar223._8_4_ = auVar173._8_4_ * fVar152 + fVar155 * auVar81._8_4_;
            auVar223._12_4_ = auVar173._12_4_ * fVar154 + fVar156 * auVar81._12_4_;
            lVar120 = uVar132 + 0x40 + lVar114;
            local_23c0 = *(undefined8 *)(lVar120 + 0x10);
            uStack_23b8 = *(undefined8 *)(lVar120 + 0x18);
            uStack_23b0 = local_23c0;
            uStack_23a8 = uStack_23b8;
            lVar114 = uVar132 + 0x50 + lVar114;
            local_2680 = *(undefined8 *)(lVar114 + 0x10);
            uStack_2678 = *(undefined8 *)(lVar114 + 0x18);
            auVar211._0_4_ = fVar157 * (float)local_2750._0_4_ + fVar141 * auVar160._0_4_;
            auVar211._4_4_ = fVar158 * (float)local_2750._4_4_ + fVar153 * auVar160._4_4_;
            auVar211._8_4_ = fVar152 * fStack_2748 + fVar155 * auVar160._8_4_;
            auVar211._12_4_ = fVar154 * fStack_2744 + fVar156 * auVar160._12_4_;
            auVar136._0_4_ = fVar157 * (float)local_2730._0_4_ + fVar141 * auVar80._0_4_;
            auVar136._4_4_ = fVar158 * (float)local_2730._4_4_ + fVar153 * auVar80._4_4_;
            auVar136._8_4_ = fVar152 * fStack_2728 + fVar155 * auVar80._8_4_;
            auVar136._12_4_ = fVar154 * fStack_2724 + fVar156 * auVar80._12_4_;
            uStack_2670 = local_2680;
            uStack_2668 = uStack_2678;
            auVar146._16_16_ = auVar188;
            auVar146._0_16_ = auVar188;
            auVar165._16_16_ = auVar163;
            auVar165._0_16_ = auVar163;
            auVar189._16_16_ = auVar221;
            auVar189._0_16_ = auVar221;
            auVar199._16_16_ = auVar223;
            auVar199._0_16_ = auVar223;
            auVar207._16_16_ = auVar211;
            auVar207._0_16_ = auVar211;
            auVar137._16_16_ = auVar136;
            auVar137._0_16_ = auVar136;
            local_28c0 = vsubps_avx(auVar177,auVar146);
            local_27e0 = vsubps_avx(auVar180,auVar165);
            auVar144 = vsubps_avx(auVar185,auVar189);
            auVar168 = vsubps_avx(auVar199,auVar177);
            auVar146 = vsubps_avx(auVar207,auVar180);
            auVar145 = vsubps_avx(auVar137,auVar185);
            fVar156 = auVar145._0_4_;
            fVar210 = local_27e0._0_4_;
            fVar17 = auVar145._4_4_;
            fVar214 = local_27e0._4_4_;
            auVar85._4_4_ = fVar214 * fVar17;
            auVar85._0_4_ = fVar210 * fVar156;
            fVar27 = auVar145._8_4_;
            fVar215 = local_27e0._8_4_;
            auVar85._8_4_ = fVar215 * fVar27;
            fVar37 = auVar145._12_4_;
            fVar216 = local_27e0._12_4_;
            auVar85._12_4_ = fVar216 * fVar37;
            fVar47 = auVar145._16_4_;
            fVar217 = local_27e0._16_4_;
            auVar85._16_4_ = fVar217 * fVar47;
            fVar57 = auVar145._20_4_;
            fVar218 = local_27e0._20_4_;
            auVar85._20_4_ = fVar218 * fVar57;
            fVar67 = auVar145._24_4_;
            fVar219 = local_27e0._24_4_;
            auVar85._24_4_ = fVar219 * fVar67;
            auVar85._28_4_ = auVar136._12_4_;
            fVar157 = auVar146._0_4_;
            fVar187 = auVar144._0_4_;
            fVar18 = auVar146._4_4_;
            fVar192 = auVar144._4_4_;
            auVar86._4_4_ = fVar192 * fVar18;
            auVar86._0_4_ = fVar187 * fVar157;
            fVar28 = auVar146._8_4_;
            fVar193 = auVar144._8_4_;
            auVar86._8_4_ = fVar193 * fVar28;
            fVar38 = auVar146._12_4_;
            fVar194 = auVar144._12_4_;
            auVar86._12_4_ = fVar194 * fVar38;
            fVar48 = auVar146._16_4_;
            fVar195 = auVar144._16_4_;
            auVar86._16_4_ = fVar195 * fVar48;
            fVar58 = auVar146._20_4_;
            fVar196 = auVar144._20_4_;
            auVar86._20_4_ = fVar196 * fVar58;
            fVar68 = auVar146._24_4_;
            fVar197 = auVar144._24_4_;
            auVar86._24_4_ = fVar197 * fVar68;
            auVar86._28_4_ = auVar188._12_4_;
            local_2800 = vsubps_avx(auVar86,auVar85);
            fVar158 = auVar168._0_4_;
            fVar19 = auVar168._4_4_;
            auVar88._4_4_ = fVar192 * fVar19;
            auVar88._0_4_ = fVar187 * fVar158;
            fVar29 = auVar168._8_4_;
            auVar88._8_4_ = fVar193 * fVar29;
            fVar39 = auVar168._12_4_;
            auVar88._12_4_ = fVar194 * fVar39;
            fVar49 = auVar168._16_4_;
            auVar88._16_4_ = fVar195 * fVar49;
            fVar59 = auVar168._20_4_;
            auVar88._20_4_ = fVar196 * fVar59;
            fVar69 = auVar168._24_4_;
            uVar87 = local_2800._28_4_;
            auVar88._24_4_ = fVar197 * fVar69;
            auVar88._28_4_ = uVar87;
            fVar152 = local_28c0._0_4_;
            fVar20 = local_28c0._4_4_;
            auVar89._4_4_ = fVar17 * fVar20;
            auVar89._0_4_ = fVar156 * fVar152;
            fVar30 = local_28c0._8_4_;
            auVar89._8_4_ = fVar27 * fVar30;
            fVar40 = local_28c0._12_4_;
            auVar89._12_4_ = fVar37 * fVar40;
            fVar50 = local_28c0._16_4_;
            auVar89._16_4_ = fVar47 * fVar50;
            fVar60 = local_28c0._20_4_;
            auVar89._20_4_ = fVar57 * fVar60;
            fVar70 = local_28c0._24_4_;
            auVar89._24_4_ = fVar67 * fVar70;
            auVar89._28_4_ = auVar163._12_4_;
            auVar144 = vsubps_avx(auVar89,auVar88);
            auVar90._4_4_ = fVar18 * fVar20;
            auVar90._0_4_ = fVar157 * fVar152;
            auVar90._8_4_ = fVar28 * fVar30;
            auVar90._12_4_ = fVar38 * fVar40;
            auVar90._16_4_ = fVar48 * fVar50;
            auVar90._20_4_ = fVar58 * fVar60;
            auVar90._24_4_ = fVar68 * fVar70;
            auVar90._28_4_ = uVar87;
            auVar91._4_4_ = fVar214 * fVar19;
            auVar91._0_4_ = fVar210 * fVar158;
            auVar91._8_4_ = fVar215 * fVar29;
            auVar91._12_4_ = fVar216 * fVar39;
            auVar91._16_4_ = fVar217 * fVar49;
            auVar91._20_4_ = fVar218 * fVar59;
            auVar91._24_4_ = fVar219 * fVar69;
            auVar91._28_4_ = local_27e0._28_4_;
            local_27a0 = vsubps_avx(auVar91,auVar90);
            uVar3 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar212._4_4_ = uVar3;
            auVar212._0_4_ = uVar3;
            auVar212._8_4_ = uVar3;
            auVar212._12_4_ = uVar3;
            auVar212._16_4_ = uVar3;
            auVar212._20_4_ = uVar3;
            auVar212._24_4_ = uVar3;
            auVar212._28_4_ = uVar3;
            uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar220._4_4_ = uVar3;
            auVar220._0_4_ = uVar3;
            auVar220._8_4_ = uVar3;
            auVar220._12_4_ = uVar3;
            auVar220._16_4_ = uVar3;
            auVar220._20_4_ = uVar3;
            auVar220._24_4_ = uVar3;
            auVar220._28_4_ = uVar3;
            uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar222._4_4_ = uVar4;
            auVar222._0_4_ = uVar4;
            auVar222._8_4_ = uVar4;
            auVar222._12_4_ = uVar4;
            auVar222._16_4_ = uVar4;
            auVar222._20_4_ = uVar4;
            auVar222._24_4_ = uVar4;
            auVar222._28_4_ = uVar4;
            fVar141 = (ray->super_RayK<1>).dir.field_0.m128[1];
            local_2780 = vsubps_avx(auVar177,auVar212);
            fVar153 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar77 = vsubps_avx(auVar180,auVar220);
            auVar182 = ZEXT3264(auVar77);
            auVar78 = vsubps_avx(auVar185,auVar222);
            fVar154 = auVar78._0_4_;
            fVar21 = auVar78._4_4_;
            auVar92._4_4_ = fVar141 * fVar21;
            auVar92._0_4_ = fVar141 * fVar154;
            fVar31 = auVar78._8_4_;
            auVar92._8_4_ = fVar141 * fVar31;
            fVar41 = auVar78._12_4_;
            auVar92._12_4_ = fVar141 * fVar41;
            fVar51 = auVar78._16_4_;
            auVar92._16_4_ = fVar141 * fVar51;
            fVar61 = auVar78._20_4_;
            auVar92._20_4_ = fVar141 * fVar61;
            fVar71 = auVar78._24_4_;
            auVar92._24_4_ = fVar141 * fVar71;
            auVar92._28_4_ = uVar3;
            fVar151 = auVar77._0_4_;
            fVar22 = auVar77._4_4_;
            auVar93._4_4_ = fVar153 * fVar22;
            auVar93._0_4_ = fVar153 * fVar151;
            fVar32 = auVar77._8_4_;
            auVar93._8_4_ = fVar153 * fVar32;
            fVar42 = auVar77._12_4_;
            auVar93._12_4_ = fVar153 * fVar42;
            fVar52 = auVar77._16_4_;
            auVar93._16_4_ = fVar153 * fVar52;
            fVar62 = auVar77._20_4_;
            auVar93._20_4_ = fVar153 * fVar62;
            fVar72 = auVar77._24_4_;
            auVar93._24_4_ = fVar153 * fVar72;
            auVar93._28_4_ = uVar4;
            auVar77 = vsubps_avx(auVar93,auVar92);
            fVar155 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar13 = local_2780._0_4_;
            fVar23 = local_2780._4_4_;
            auVar94._4_4_ = fVar153 * fVar23;
            auVar94._0_4_ = fVar153 * fVar13;
            fVar33 = local_2780._8_4_;
            auVar94._8_4_ = fVar153 * fVar33;
            fVar43 = local_2780._12_4_;
            auVar94._12_4_ = fVar153 * fVar43;
            fVar53 = local_2780._16_4_;
            auVar94._16_4_ = fVar153 * fVar53;
            fVar63 = local_2780._20_4_;
            auVar94._20_4_ = fVar153 * fVar63;
            fVar73 = local_2780._24_4_;
            auVar94._24_4_ = fVar153 * fVar73;
            auVar94._28_4_ = uVar87;
            auVar95._4_4_ = fVar155 * fVar21;
            auVar95._0_4_ = fVar155 * fVar154;
            auVar95._8_4_ = fVar155 * fVar31;
            auVar95._12_4_ = fVar155 * fVar41;
            auVar95._16_4_ = fVar155 * fVar51;
            auVar95._20_4_ = fVar155 * fVar61;
            auVar95._24_4_ = fVar155 * fVar71;
            auVar95._28_4_ = auVar188._12_4_;
            auVar78 = vsubps_avx(auVar95,auVar94);
            auVar96._4_4_ = fVar155 * fVar22;
            auVar96._0_4_ = fVar155 * fVar151;
            auVar96._8_4_ = fVar155 * fVar32;
            auVar96._12_4_ = fVar155 * fVar42;
            auVar96._16_4_ = fVar155 * fVar52;
            auVar96._20_4_ = fVar155 * fVar62;
            auVar96._24_4_ = fVar155 * fVar72;
            auVar96._28_4_ = auVar188._12_4_;
            auVar97._4_4_ = fVar141 * fVar23;
            auVar97._0_4_ = fVar141 * fVar13;
            auVar97._8_4_ = fVar141 * fVar33;
            auVar97._12_4_ = fVar141 * fVar43;
            auVar97._16_4_ = fVar141 * fVar53;
            auVar97._20_4_ = fVar141 * fVar63;
            auVar97._24_4_ = fVar141 * fVar73;
            auVar97._28_4_ = local_2780._28_4_;
            auVar79 = vsubps_avx(auVar97,auVar96);
            fVar14 = local_27a0._0_4_;
            fVar24 = local_27a0._4_4_;
            fVar34 = local_27a0._8_4_;
            fVar44 = local_27a0._12_4_;
            fVar54 = local_27a0._16_4_;
            fVar64 = local_27a0._20_4_;
            fVar74 = local_27a0._24_4_;
            fVar15 = auVar144._0_4_;
            fVar25 = auVar144._4_4_;
            fVar35 = auVar144._8_4_;
            fVar45 = auVar144._12_4_;
            fVar55 = auVar144._16_4_;
            fVar65 = auVar144._20_4_;
            fVar75 = auVar144._24_4_;
            auVar171 = ZEXT3264(local_2800);
            fVar16 = local_2800._0_4_;
            fVar26 = local_2800._4_4_;
            fVar36 = local_2800._8_4_;
            fVar46 = local_2800._12_4_;
            fVar56 = local_2800._16_4_;
            fVar66 = local_2800._20_4_;
            fVar76 = local_2800._24_4_;
            auVar166._0_4_ = fVar155 * fVar16 + fVar141 * fVar15 + fVar153 * fVar14;
            auVar166._4_4_ = fVar155 * fVar26 + fVar141 * fVar25 + fVar153 * fVar24;
            auVar166._8_4_ = fVar155 * fVar36 + fVar141 * fVar35 + fVar153 * fVar34;
            auVar166._12_4_ = fVar155 * fVar46 + fVar141 * fVar45 + fVar153 * fVar44;
            auVar166._16_4_ = fVar155 * fVar56 + fVar141 * fVar55 + fVar153 * fVar54;
            auVar166._20_4_ = fVar155 * fVar66 + fVar141 * fVar65 + fVar153 * fVar64;
            auVar166._24_4_ = fVar155 * fVar76 + fVar141 * fVar75 + fVar153 * fVar74;
            auVar166._28_4_ = fVar153 + fVar153 + local_2780._28_4_;
            auVar147._8_4_ = 0x80000000;
            auVar147._0_8_ = 0x8000000080000000;
            auVar147._12_4_ = 0x80000000;
            auVar147._16_4_ = 0x80000000;
            auVar147._20_4_ = 0x80000000;
            auVar147._24_4_ = 0x80000000;
            auVar147._28_4_ = 0x80000000;
            auVar144 = vandps_avx(auVar166,auVar147);
            uVar198 = auVar144._0_4_;
            auVar183._0_4_ =
                 (float)(uVar198 ^
                        (uint)(fVar158 * auVar77._0_4_ +
                              fVar157 * auVar78._0_4_ + fVar156 * auVar79._0_4_));
            uVar112 = auVar144._4_4_;
            auVar183._4_4_ =
                 (float)(uVar112 ^
                        (uint)(fVar19 * auVar77._4_4_ +
                              fVar18 * auVar78._4_4_ + fVar17 * auVar79._4_4_));
            uVar201 = auVar144._8_4_;
            auVar183._8_4_ =
                 (float)(uVar201 ^
                        (uint)(fVar29 * auVar77._8_4_ +
                              fVar28 * auVar78._8_4_ + fVar27 * auVar79._8_4_));
            uVar202 = auVar144._12_4_;
            auVar183._12_4_ =
                 (float)(uVar202 ^
                        (uint)(fVar39 * auVar77._12_4_ +
                              fVar38 * auVar78._12_4_ + fVar37 * auVar79._12_4_));
            uVar203 = auVar144._16_4_;
            auVar183._16_4_ =
                 (float)(uVar203 ^
                        (uint)(fVar49 * auVar77._16_4_ +
                              fVar48 * auVar78._16_4_ + fVar47 * auVar79._16_4_));
            uVar204 = auVar144._20_4_;
            auVar183._20_4_ =
                 (float)(uVar204 ^
                        (uint)(fVar59 * auVar77._20_4_ +
                              fVar58 * auVar78._20_4_ + fVar57 * auVar79._20_4_));
            uVar205 = auVar144._24_4_;
            auVar183._24_4_ =
                 (float)(uVar205 ^
                        (uint)(fVar69 * auVar77._24_4_ +
                              fVar68 * auVar78._24_4_ + fVar67 * auVar79._24_4_));
            uVar206 = auVar144._28_4_;
            auVar183._28_4_ =
                 (float)(uVar206 ^ (uint)(auVar168._28_4_ + auVar146._28_4_ + auVar145._28_4_));
            auVar190._0_4_ =
                 (float)(uVar198 ^
                        (uint)(auVar77._0_4_ * fVar152 +
                              auVar78._0_4_ * fVar210 + fVar187 * auVar79._0_4_));
            auVar190._4_4_ =
                 (float)(uVar112 ^
                        (uint)(auVar77._4_4_ * fVar20 +
                              auVar78._4_4_ * fVar214 + fVar192 * auVar79._4_4_));
            auVar190._8_4_ =
                 (float)(uVar201 ^
                        (uint)(auVar77._8_4_ * fVar30 +
                              auVar78._8_4_ * fVar215 + fVar193 * auVar79._8_4_));
            auVar190._12_4_ =
                 (float)(uVar202 ^
                        (uint)(auVar77._12_4_ * fVar40 +
                              auVar78._12_4_ * fVar216 + fVar194 * auVar79._12_4_));
            auVar190._16_4_ =
                 (float)(uVar203 ^
                        (uint)(auVar77._16_4_ * fVar50 +
                              auVar78._16_4_ * fVar217 + fVar195 * auVar79._16_4_));
            auVar190._20_4_ =
                 (float)(uVar204 ^
                        (uint)(auVar77._20_4_ * fVar60 +
                              auVar78._20_4_ * fVar218 + fVar196 * auVar79._20_4_));
            auVar190._24_4_ =
                 (float)(uVar205 ^
                        (uint)(auVar77._24_4_ * fVar70 +
                              auVar78._24_4_ * fVar219 + fVar197 * auVar79._24_4_));
            auVar190._28_4_ = (float)(uVar206 ^ (uint)(auVar78._28_4_ + auVar79._28_4_ + -0.0));
            auVar168 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar144 = vcmpps_avx(auVar183,auVar168,5);
            auVar168 = vcmpps_avx(auVar190,auVar168,5);
            auVar144 = vandps_avx(auVar144,auVar168);
            auVar148._8_4_ = 0x7fffffff;
            auVar148._0_8_ = 0x7fffffff7fffffff;
            auVar148._12_4_ = 0x7fffffff;
            auVar148._16_4_ = 0x7fffffff;
            auVar148._20_4_ = 0x7fffffff;
            auVar148._24_4_ = 0x7fffffff;
            auVar148._28_4_ = 0x7fffffff;
            local_2600 = vandps_avx(auVar166,auVar148);
            auVar178 = ZEXT3264(local_2600);
            auVar168 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar166,4);
            auVar144 = vandps_avx(auVar144,auVar168);
            auVar149._0_4_ = auVar190._0_4_ + auVar183._0_4_;
            auVar149._4_4_ = auVar190._4_4_ + auVar183._4_4_;
            auVar149._8_4_ = auVar190._8_4_ + auVar183._8_4_;
            auVar149._12_4_ = auVar190._12_4_ + auVar183._12_4_;
            auVar149._16_4_ = auVar190._16_4_ + auVar183._16_4_;
            auVar149._20_4_ = auVar190._20_4_ + auVar183._20_4_;
            auVar149._24_4_ = auVar190._24_4_ + auVar183._24_4_;
            auVar149._28_4_ = auVar190._28_4_ + auVar183._28_4_;
            auVar146 = vcmpps_avx(auVar149,local_2600,2);
            auVar168 = vandps_avx(auVar144,auVar146);
            auVar145 = local_26a0 & auVar168;
            if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar145 >> 0x7f,0) != '\0') ||
                  (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar145 >> 0xbf,0) != '\0') ||
                (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar145[0x1f] < '\0') {
              auVar168 = vandps_avx(auVar168,local_26a0);
              local_2620._0_4_ =
                   (float)(uVar198 ^ (uint)(fVar16 * fVar13 + fVar15 * fVar151 + fVar154 * fVar14));
              local_2620._4_4_ =
                   (float)(uVar112 ^ (uint)(fVar26 * fVar23 + fVar25 * fVar22 + fVar21 * fVar24));
              local_2620._8_4_ =
                   (float)(uVar201 ^ (uint)(fVar36 * fVar33 + fVar35 * fVar32 + fVar31 * fVar34));
              local_2620._12_4_ =
                   (float)(uVar202 ^ (uint)(fVar46 * fVar43 + fVar45 * fVar42 + fVar41 * fVar44));
              local_2620._16_4_ =
                   (float)(uVar203 ^ (uint)(fVar56 * fVar53 + fVar55 * fVar52 + fVar51 * fVar54));
              local_2620._20_4_ =
                   (float)(uVar204 ^ (uint)(fVar66 * fVar63 + fVar65 * fVar62 + fVar61 * fVar64));
              local_2620._24_4_ =
                   (float)(uVar205 ^ (uint)(fVar76 * fVar73 + fVar75 * fVar72 + fVar71 * fVar74));
              local_2620._28_4_ =
                   uVar206 ^ (uint)(auVar146._28_4_ + auVar146._28_4_ + auVar144._28_4_);
              auVar182 = ZEXT3264(local_2620);
              fVar141 = (ray->super_RayK<1>).org.field_0.m128[3];
              fVar153 = local_2600._0_4_;
              fVar155 = local_2600._4_4_;
              auVar98._4_4_ = fVar155 * fVar141;
              auVar98._0_4_ = fVar153 * fVar141;
              fVar156 = local_2600._8_4_;
              auVar98._8_4_ = fVar156 * fVar141;
              fVar157 = local_2600._12_4_;
              auVar98._12_4_ = fVar157 * fVar141;
              fVar158 = local_2600._16_4_;
              auVar98._16_4_ = fVar158 * fVar141;
              fVar152 = local_2600._20_4_;
              auVar98._20_4_ = fVar152 * fVar141;
              fVar154 = local_2600._24_4_;
              auVar98._24_4_ = fVar154 * fVar141;
              auVar98._28_4_ = fVar141;
              auVar144 = vcmpps_avx(auVar98,local_2620,1);
              fVar141 = (ray->super_RayK<1>).tfar;
              auVar99._4_4_ = fVar155 * fVar141;
              auVar99._0_4_ = fVar153 * fVar141;
              auVar99._8_4_ = fVar156 * fVar141;
              auVar99._12_4_ = fVar157 * fVar141;
              auVar99._16_4_ = fVar158 * fVar141;
              auVar99._20_4_ = fVar152 * fVar141;
              auVar99._24_4_ = fVar154 * fVar141;
              auVar99._28_4_ = fVar141;
              auVar146 = vcmpps_avx(local_2620,auVar99,2);
              auVar144 = vandps_avx(auVar146,auVar144);
              auVar171 = ZEXT3264(auVar144);
              auVar146 = auVar168 & auVar144;
              if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar146 >> 0x7f,0) != '\0') ||
                    (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar146 >> 0xbf,0) != '\0') ||
                  (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar146[0x1f] < '\0') {
                auVar144 = vandps_avx(auVar168,auVar144);
                local_25c0 = auVar144;
                auVar168 = vsubps_avx(local_2600,auVar190);
                local_2660 = vblendvps_avx(auVar183,auVar168,local_24c0);
                auVar168 = vsubps_avx(local_2600,auVar183);
                local_2640 = vblendvps_avx(auVar190,auVar168,local_24c0);
                local_2540[0] = fVar16 * (float)local_24e0._0_4_;
                local_2540[1] = fVar26 * (float)local_24e0._4_4_;
                local_2540[2] = fVar36 * fStack_24d8;
                local_2540[3] = fVar46 * fStack_24d4;
                fStack_2530 = fVar56 * fStack_24d0;
                fStack_252c = fVar66 * fStack_24cc;
                fStack_2528 = fVar76 * fStack_24c8;
                fStack_2524 = auVar190._28_4_;
                local_2520[0] = fVar15 * (float)local_24e0._0_4_;
                local_2520[1] = fVar25 * (float)local_24e0._4_4_;
                local_2520[2] = fVar35 * fStack_24d8;
                local_2520[3] = fVar45 * fStack_24d4;
                fStack_2510 = fVar55 * fStack_24d0;
                fStack_250c = fVar65 * fStack_24cc;
                fStack_2508 = fVar75 * fStack_24c8;
                fStack_2504 = auVar190._28_4_;
                auVar168 = vrcpps_avx(local_2600);
                local_2500[0] = (float)local_24e0._0_4_ * fVar14;
                local_2500[1] = (float)local_24e0._4_4_ * fVar24;
                local_2500[2] = fStack_24d8 * fVar34;
                local_2500[3] = fStack_24d4 * fVar44;
                fStack_24f0 = fStack_24d0 * fVar54;
                fStack_24ec = fStack_24cc * fVar64;
                fStack_24e8 = fStack_24c8 * fVar74;
                uStack_24e4 = uStack_24c4;
                fVar141 = auVar168._0_4_;
                fVar151 = auVar168._4_4_;
                auVar100._4_4_ = fVar155 * fVar151;
                auVar100._0_4_ = fVar153 * fVar141;
                fVar153 = auVar168._8_4_;
                auVar100._8_4_ = fVar156 * fVar153;
                fVar155 = auVar168._12_4_;
                auVar100._12_4_ = fVar157 * fVar155;
                fVar156 = auVar168._16_4_;
                auVar100._16_4_ = fVar158 * fVar156;
                fVar157 = auVar168._20_4_;
                auVar100._20_4_ = fVar152 * fVar157;
                fVar158 = auVar168._24_4_;
                auVar100._24_4_ = fVar154 * fVar158;
                auVar100._28_4_ = local_2600._28_4_;
                auVar181._8_4_ = 0x3f800000;
                auVar181._0_8_ = &DAT_3f8000003f800000;
                auVar181._12_4_ = 0x3f800000;
                auVar181._16_4_ = 0x3f800000;
                auVar181._20_4_ = 0x3f800000;
                auVar181._24_4_ = 0x3f800000;
                auVar181._28_4_ = 0x3f800000;
                auVar182 = ZEXT3264(auVar181);
                auVar168 = vsubps_avx(auVar181,auVar100);
                fVar141 = fVar141 + fVar141 * auVar168._0_4_;
                fVar151 = fVar151 + fVar151 * auVar168._4_4_;
                fVar153 = fVar153 + fVar153 * auVar168._8_4_;
                fVar155 = fVar155 + fVar155 * auVar168._12_4_;
                fVar156 = fVar156 + fVar156 * auVar168._16_4_;
                fVar157 = fVar157 + fVar157 * auVar168._20_4_;
                fVar158 = fVar158 + fVar158 * auVar168._24_4_;
                local_28c0._4_4_ = fVar151 * local_2620._4_4_;
                local_28c0._0_4_ = fVar141 * local_2620._0_4_;
                local_28c0._8_4_ = fVar153 * local_2620._8_4_;
                local_28c0._12_4_ = fVar155 * local_2620._12_4_;
                local_28c0._16_4_ = fVar156 * local_2620._16_4_;
                local_28c0._20_4_ = fVar157 * local_2620._20_4_;
                local_28c0._24_4_ = fVar158 * local_2620._24_4_;
                local_28c0._28_4_ = auVar168._28_4_;
                local_27c0 = auVar144;
                local_2560 = local_28c0;
                local_25a0[0] = local_2660._0_4_ * fVar141;
                local_25a0[1] = local_2660._4_4_ * fVar151;
                local_25a0[2] = local_2660._8_4_ * fVar153;
                local_25a0[3] = local_2660._12_4_ * fVar155;
                fStack_2590 = local_2660._16_4_ * fVar156;
                fStack_258c = local_2660._20_4_ * fVar157;
                fStack_2588 = local_2660._24_4_ * fVar158;
                uStack_2584 = local_2660._28_4_;
                local_2580[0] = local_2640._0_4_ * fVar141;
                local_2580[1] = local_2640._4_4_ * fVar151;
                local_2580[2] = local_2640._8_4_ * fVar153;
                local_2580[3] = local_2640._12_4_ * fVar155;
                fStack_2570 = local_2640._16_4_ * fVar156;
                fStack_256c = local_2640._20_4_ * fVar157;
                fStack_2568 = local_2640._24_4_ * fVar158;
                uStack_2564 = local_2640._28_4_;
                auVar138._8_4_ = 0x7f800000;
                auVar138._0_8_ = 0x7f8000007f800000;
                auVar138._12_4_ = 0x7f800000;
                auVar138._16_4_ = 0x7f800000;
                auVar138._20_4_ = 0x7f800000;
                auVar138._24_4_ = 0x7f800000;
                auVar138._28_4_ = 0x7f800000;
                auVar168 = vblendvps_avx(auVar138,local_28c0,auVar144);
                auVar146 = vshufps_avx(auVar168,auVar168,0xb1);
                auVar146 = vminps_avx(auVar168,auVar146);
                auVar145 = vshufpd_avx(auVar146,auVar146,5);
                auVar146 = vminps_avx(auVar146,auVar145);
                auVar145 = vperm2f128_avx(auVar146,auVar146,1);
                auVar146 = vminps_avx(auVar146,auVar145);
                auVar168 = vcmpps_avx(auVar168,auVar146,0);
                auVar146 = auVar144 & auVar168;
                if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar146 >> 0x7f,0) != '\0') ||
                      (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar146 >> 0xbf,0) != '\0') ||
                    (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar146[0x1f] < '\0') {
                  auVar144 = vandps_avx(auVar168,auVar144);
                }
                auVar171 = ZEXT3264(auVar144);
                uVar112 = vmovmskps_avx(auVar144);
                uVar198 = 0;
                _local_2760 = auVar101;
                _local_2750 = auVar102;
                _local_2740 = auVar103;
                _local_2730 = auVar104;
                _local_2720 = auVar105;
                _local_2710 = auVar106;
                _local_2700 = auVar107;
                _local_26f0 = auVar108;
                _local_26e0 = auVar109;
                _local_26d0 = auVar110;
                _local_26c0 = auVar111;
                if (uVar112 != 0) {
                  for (; (uVar112 >> uVar198 & 1) == 0; uVar198 = uVar198 + 1) {
                  }
                }
                do {
                  auVar178 = ZEXT3264(local_28c0);
                  uVar117 = CONCAT44(0,uVar198);
                  uVar198 = *(uint *)((long)&local_23c0 + uVar117 * 4);
                  pGVar8 = (pSVar6->geometries).items[uVar198].ptr;
                  if ((pGVar8->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_27c0 + uVar117 * 4) = 0;
                  }
                  else {
                    pRVar11 = context->args;
                    if ((pRVar11->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar141 = local_25a0[uVar117];
                      fVar153 = local_2580[uVar117];
                      (ray->super_RayK<1>).tfar = *(float *)(local_2560 + uVar117 * 4);
                      (ray->Ng).field_0.field_0.x = local_2540[uVar117];
                      (ray->Ng).field_0.field_0.y = local_2520[uVar117];
                      (ray->Ng).field_0.field_0.z = local_2500[uVar117];
                      ray->u = fVar141;
                      ray->v = fVar153;
                      ray->primID = *(uint *)((long)&local_2680 + uVar117 * 4);
                      ray->geomID = uVar198;
                      pRVar12 = context->user;
                      ray->instID[0] = pRVar12->instID[0];
                      ray->instPrimID[0] = pRVar12->instPrimID[0];
                      break;
                    }
                    local_28f0.context = context->user;
                    local_282c = local_2520[uVar117];
                    auVar171 = ZEXT464((uint)local_282c);
                    local_2830 = local_2540[uVar117];
                    local_2828 = local_2500[uVar117];
                    local_2824 = local_25a0[uVar117];
                    local_2820 = local_2580[uVar117];
                    local_281c = *(undefined4 *)((long)&local_2680 + uVar117 * 4);
                    local_2818 = uVar198;
                    local_2814 = (local_28f0.context)->instID[0];
                    local_2810 = (local_28f0.context)->instPrimID[0];
                    local_2800._0_4_ = (ray->super_RayK<1>).tfar;
                    local_27e0._0_8_ = uVar117;
                    (ray->super_RayK<1>).tfar = *(float *)(local_2560 + uVar117 * 4);
                    local_28f4 = -1;
                    local_28f0.valid = &local_28f4;
                    local_28f0.geometryUserPtr = pGVar8->userPtr;
                    local_28f0.ray = (RTCRayN *)ray;
                    local_28f0.hit = (RTCHitN *)&local_2830;
                    local_28f0.N = 1;
                    if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_015bc4a6:
                      if (pRVar11->filter != (RTCFilterFunctionN)0x0) {
                        if (((pRVar11->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                          auVar171 = ZEXT1664(auVar171._0_16_);
                          auVar182 = ZEXT1664(auVar182._0_16_);
                          (*pRVar11->filter)(&local_28f0);
                        }
                        if (*local_28f0.valid == 0) goto LAB_015bc570;
                      }
                      (((Vec3f *)((long)local_28f0.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_28f0.hit;
                      (((Vec3f *)((long)local_28f0.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_28f0.hit + 4);
                      (((Vec3f *)((long)local_28f0.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_28f0.hit + 8);
                      *(float *)((long)local_28f0.ray + 0x3c) = *(float *)(local_28f0.hit + 0xc);
                      *(float *)((long)local_28f0.ray + 0x40) = *(float *)(local_28f0.hit + 0x10);
                      *(float *)((long)local_28f0.ray + 0x44) = *(float *)(local_28f0.hit + 0x14);
                      *(float *)((long)local_28f0.ray + 0x48) = *(float *)(local_28f0.hit + 0x18);
                      *(float *)((long)local_28f0.ray + 0x4c) = *(float *)(local_28f0.hit + 0x1c);
                      *(float *)((long)local_28f0.ray + 0x50) = *(float *)(local_28f0.hit + 0x20);
                    }
                    else {
                      auVar171 = ZEXT464((uint)local_282c);
                      auVar182 = ZEXT1664(auVar182._0_16_);
                      (*pGVar8->intersectionFilterN)(&local_28f0);
                      if (*local_28f0.valid != 0) goto LAB_015bc4a6;
LAB_015bc570:
                      (ray->super_RayK<1>).tfar = (float)local_2800._0_4_;
                    }
                    *(undefined4 *)(local_27c0 + local_27e0._0_8_ * 4) = 0;
                    fVar141 = (ray->super_RayK<1>).tfar;
                    auVar139._4_4_ = fVar141;
                    auVar139._0_4_ = fVar141;
                    auVar139._8_4_ = fVar141;
                    auVar139._12_4_ = fVar141;
                    auVar139._16_4_ = fVar141;
                    auVar139._20_4_ = fVar141;
                    auVar139._24_4_ = fVar141;
                    auVar139._28_4_ = fVar141;
                    auVar178 = ZEXT3264(local_28c0);
                    auVar144 = vcmpps_avx(local_28c0,auVar139,2);
                    local_27c0 = vandps_avx(auVar144,local_27c0);
                  }
                  if ((((((((local_27c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_27c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_27c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_27c0 >> 0x7f,0) == '\0') &&
                        (local_27c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_27c0 >> 0xbf,0) == '\0') &&
                      (local_27c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_27c0[0x1f]) break;
                  local_28c0 = auVar178._0_32_;
                  BVHNIntersector1<8,16777232,false,embree::avx::ArrayIntersector1<embree::avx::QuadMiMBIntersector1Moeller<4,true>>>
                  ::intersect(&local_28f0);
                  uVar198 = (uint)local_28f0.valid;
                } while( true );
              }
            }
            lVar115 = lVar115 + 1;
          } while (lVar115 != local_2860);
        }
        fVar141 = (ray->super_RayK<1>).tfar;
        auVar140 = ZEXT3264(CONCAT428(fVar141,CONCAT424(fVar141,CONCAT420(fVar141,CONCAT416(fVar141,
                                                  CONCAT412(fVar141,CONCAT48(fVar141,CONCAT44(
                                                  fVar141,fVar141))))))));
        auVar184 = ZEXT3264(local_23e0);
        auVar186 = ZEXT3264(local_2400);
        auVar191 = ZEXT3264(local_2420);
        auVar200 = ZEXT3264(local_2440);
        auVar208 = ZEXT3264(local_2460);
        auVar209 = ZEXT3264(local_2480);
        auVar213 = ZEXT3264(local_24a0);
        uVar117 = local_2880;
        uVar122 = local_2878;
        uVar123 = local_2890;
        uVar124 = local_2888;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }